

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O2

string * __thiscall
banksia::ChessBoard::getFen_abi_cxx11_
          (string *__return_storage_ptr__,ChessBoard *this,int halfCount,int fullMoveCount)

{
  ostream *poVar1;
  int pos;
  char *pcVar2;
  int iVar3;
  int i;
  uint uVar4;
  Piece piece;
  ostringstream stringStream;
  Piece local_1d0;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  iVar3 = 0;
  for (uVar4 = 0; uVar4 != 0x40; uVar4 = uVar4 + 1) {
    local_1d0 = BoardCore::getPiece(&this->super_BoardCore,uVar4);
    if (local_1d0.type == empty) {
      iVar3 = iVar3 + 1;
      if ((~uVar4 & 7) == 0) {
        if (iVar3 != 0) {
          std::ostream::operator<<(local_1a8,iVar3);
        }
        if (uVar4 != 0x3f) goto LAB_001640b9;
        goto LAB_001640c8;
      }
    }
    else {
      if (iVar3 != 0) {
        std::ostream::operator<<(local_1a8,iVar3);
      }
      Piece::toString_abi_cxx11_(&local_1c8,&local_1d0);
      std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      if (uVar4 != 0x3f && (~uVar4 & 7) == 0) {
LAB_001640b9:
        std::operator<<((ostream *)local_1a8,"/");
      }
LAB_001640c8:
      iVar3 = 0;
    }
  }
  pcVar2 = " b ";
  if ((this->super_BoardCore).side == white) {
    pcVar2 = " w ";
  }
  std::operator<<((ostream *)local_1a8,pcVar2);
  uVar4 = (uint)this->castleRights[1];
  if ((int)this->castleRights[0] + uVar4 == 0) {
    pcVar2 = "-";
  }
  else {
    if ((this->CastleRight_short & uVar4) != 0) {
      std::operator<<((ostream *)local_1a8,"K");
      uVar4 = (uint)this->castleRights[1];
    }
    if ((this->CastleRight_long & uVar4) != 0) {
      std::operator<<((ostream *)local_1a8,"Q");
    }
    uVar4 = (uint)this->castleRights[0];
    if ((this->CastleRight_short & uVar4) != 0) {
      std::operator<<((ostream *)local_1a8,"k");
      uVar4 = (uint)this->castleRights[0];
    }
    if ((this->CastleRight_long & uVar4) == 0) goto LAB_00164191;
    pcVar2 = "q";
  }
  std::operator<<((ostream *)local_1a8,pcVar2);
LAB_00164191:
  std::operator<<((ostream *)local_1a8," ");
  if (this->enpassant < 1) {
    std::operator<<((ostream *)local_1a8,"-");
  }
  else {
    posToCoordinateString_abi_cxx11_(&local_1c8,(banksia *)(ulong)(uint)this->enpassant,pos);
    std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  poVar1 = std::operator<<((ostream *)local_1a8," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,halfCount);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,fullMoveCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string ChessBoard::getFen(int halfCount, int fullMoveCount) const {
    std::ostringstream stringStream;
    
    int e = 0;
    for (int i=0; i < 64; i++) {
        auto piece = getPiece(i);
        if (piece.isEmpty()) {
            e += 1;
        } else {
            if (e) {
                stringStream << e;
                e = 0;
            }
            stringStream << piece.toString();
        }
        
        if (i % 8 == 7) {
            if (e) {
                stringStream << e;
            }
            if (i < 63) {
                stringStream << "/";
            }
            e = 0;
        }
    }
    
    stringStream << (side == Side::white ? " w " : " b ");
    
    if (castleRights[W] + castleRights[B]) {
        if (castleRights[W] & CastleRight_short) {
            stringStream << "K";
        }
        if (castleRights[W] & CastleRight_long) {
            stringStream << "Q";
        }
        if (castleRights[B] & CastleRight_short) {
            stringStream << "k";
        }
        if (castleRights[B] & CastleRight_long) {
            stringStream << "q";
        }
    } else {
        stringStream << "-";
    }
    
    stringStream << " ";
    if (enpassant > 0) {
        stringStream << posToCoordinateString(enpassant);
    } else {
        stringStream << "-";
    }
    
    stringStream << " " << halfCount << " " << fullMoveCount;
    
    return stringStream.str();
}